

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test3::writeMainBody
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  pointer puVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  undefined *puVar5;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  GPUShaderFP64Test3 *this_00;
  pointer puVar9;
  uint uVar10;
  uint uVar11;
  bool *local_50;
  
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    local_50 = (bool *)m_varying_name_fs_out_fs_result;
    break;
  case GEOMETRY_SHADER:
    local_50 = (bool *)m_varying_name_gs_fs_gs_result;
    break;
  case TESS_CONTROL_SHADER:
    local_50 = (bool *)m_varying_name_tcs_tes_tcs_result;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"void main()\n{\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "gl_TessLevelOuter[0] = 1.0;\ngl_TessLevelOuter[1] = 1.0;\ngl_TessLevelOuter[2] = 1.0;\ngl_TessLevelOuter[3] = 1.0;\ngl_TessLevelInner[0] = 1.0;\ngl_TessLevelInner[1] = 1.0;\n\n"
               ,0xa9);
    bVar4 = true;
    goto LAB_009259a1;
  case TESS_EVAL_SHADER:
    local_50 = (bool *)m_varying_name_tes_gs_tes_result;
    break;
  case VERTEX_SHADER:
    local_50 = (bool *)m_varying_name_vs_tcs_vs_result;
    break;
  default:
    local_50 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"void main()\n{\n",0xe);
  bVar4 = false;
LAB_009259a1:
  puVar9 = (this->m_uniform_details).
           super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_uniform_details).
           super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = (int)stream;
  if (puVar1 != puVar9) {
    uVar11 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
      if (uVar11 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"else ",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"if (",4);
      pcVar2 = puVar9->m_type_name;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)stream->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
      if (puVar9->m_n_elements != 0) {
        uVar10 = 0;
        do {
          std::ostream::_M_insert<double>
                    ((this->m_base_element - (double)uVar10) * 0.25 +
                     (double)uVar11 * 13.0 + this->m_base_type_ordinal);
          uVar6 = puVar9->m_n_elements;
          uVar10 = uVar10 + 1;
          if (uVar10 != uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
            uVar6 = puVar9->m_n_elements;
          }
        } while (uVar10 < uVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,") != ",5);
      puVar5 = m_uniform_block_instance_name;
      if (m_uniform_block_instance_name == (undefined *)0x0) {
        std::ios::clear(iVar3 + (int)stream->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(m_uniform_block_instance_name);
        std::__ostream_insert<char,std::char_traits<char>>(stream,puVar5,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,".",1);
      pcVar2 = puVar9->m_name;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)stream->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,")\n    {\n        ",0x10);
      if (local_50 == (bool *)0x0) {
        std::ios::clear(iVar3 + (int)stream->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(local_50);
        std::__ostream_insert<char,std::char_traits<char>>(stream,local_50,sVar7);
      }
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"[gl_InvocationID]",0x11);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
      puVar9 = puVar9 + 1;
      uVar11 = uVar11 + 1;
    } while (puVar1 != puVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    else\n    {\n        ",0x17);
  if (local_50 == (bool *)0x0) {
    std::ios::clear(iVar3 + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,local_50,sVar7);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[gl_InvocationID]",0x11);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
  this_00 = (GPUShaderFP64Test3 *)std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  writeVaryingPassthrough(this_00,stream,shader_stage);
  if (shader_stage == GEOMETRY_SHADER) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\ngl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);EmitVertex();\nEndPrimitive();\n",0x4a)
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"}\n\n",3);
  return;
}

Assistant:

void GPUShaderFP64Test3::writeMainBody(std::ostream& stream, shaderStage shader_stage) const
{
	glw::GLuint		   type_ordinal = 1;
	const glw::GLchar* varying_name = "";

	/* Select name for varying that will hold result of "that" shader_stage */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		varying_name = m_varying_name_fs_out_fs_result;
		break;
	case GEOMETRY_SHADER:
		varying_name = m_varying_name_gs_fs_gs_result;
		break;
	case TESS_CONTROL_SHADER:
		varying_name = m_varying_name_tcs_tes_tcs_result;
		break;
	case TESS_EVAL_SHADER:
		varying_name = m_varying_name_tes_gs_tes_result;
		break;
	case VERTEX_SHADER:
		varying_name = m_varying_name_vs_tcs_vs_result;
		break;
	}

	/* void main() */
	stream << "void main()\n"
			  "{\n";

	/* Tesselation levels output */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "gl_TessLevelOuter[0] = 1.0;\n"
				  "gl_TessLevelOuter[1] = 1.0;\n"
				  "gl_TessLevelOuter[2] = 1.0;\n"
				  "gl_TessLevelOuter[3] = 1.0;\n"
				  "gl_TessLevelInner[0] = 1.0;\n"
				  "gl_TessLevelInner[1] = 1.0;\n"
				  "\n";
	}

	/* For each "double precision" uniform
	 *
	 * [else] if (TYPE_NAME(PREDIFINED_VALUES) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
	 * {
	 *     VARYING_NAME = m_result_failure;
	 * }
	 */
	for (std::vector<uniformDetails>::const_iterator it = m_uniform_details.begin(), end = m_uniform_details.end();
		 end != it; ++it, ++type_ordinal)
	{
		stream << "    ";

		/* First comparison is done with if, next with else if */
		if (1 != type_ordinal)
		{
			stream << "else ";
		}

		/* if (TYPE_NAME( */
		stream << "if (" << it->m_type_name << "(";

		/* PREDIFINED_VALUES */
		for (glw::GLuint element = 0; element < it->m_n_elements; ++element)
		{
			stream << getExpectedValue(type_ordinal, element);

			/* Separate with comma */
			if (it->m_n_elements != element + 1)
			{
				stream << ", ";
			}
		}

		/*
		 * ) != NAMED_UNIFORM_BLOCK_NAME.UNIFORM_NAME)
		 * {
		 *     VARYING_NAME
		 */
		stream << ") != " << m_uniform_block_instance_name << "." << it->m_name << ")\n"
																				   "    {\n"
																				   "        "
			   << varying_name;

		/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
		if (TESS_CONTROL_SHADER == shader_stage)
		{
			stream << "[gl_InvocationID]";
		}

		/*
		 * = m_result_failure;
		 * }
		 */
		stream << " = " << m_result_failure << ";\n"
			   << "    }\n";
	}

	/* If all comparisons are ok
	 *
	 *     else
	 *     {
	 *         VARYING_NAME = m_result_success;
	 *     }
	 */

	/*
	 * else
	 * {
	 *     VARYING_NAME
	 */
	stream << "    else\n"
			  "    {\n"
			  "        "
		   << varying_name;

	/* Tesselation control outputs have to be arrays indexed with gl_InvocationID */
	if (TESS_CONTROL_SHADER == shader_stage)
	{
		stream << "[gl_InvocationID]";
	}

	/*
	 * = m_result_success;
	 * }
	 *
	 */
	stream << " = " << m_result_success << ";\n"
		   << "    }\n"
		   << "\n";

	/* For each pair of "input/output" varyings
	 *
	 * OUTPUT_VARYING_NAME = INPUT_VARYING_NAME;
	 **/
	writeVaryingPassthrough(stream, shader_stage);

	/* Geometry shader have to emit vertex */
	if (GEOMETRY_SHADER == shader_stage)
	{
		stream << "\n"
				  "gl_Position = vec4(0.0f, 0.0f, 0.0f, 1.0f);"
				  "EmitVertex();\n"
				  "EndPrimitive();\n";
	}

	/* Close scope of main */
	stream << "}\n\n";
}